

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jobs.cpp
# Opt level: O2

void __thiscall
JsUtil::BackgroundJobProcessor::~BackgroundJobProcessor(BackgroundJobProcessor *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint i;
  ulong uVar4;
  
  if ((this->super_JobProcessor).isClosed == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x296,"(IsClosed())","IsClosed()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (this->parallelThreadData != (ParallelThreadData **)0x0) {
    for (uVar4 = 0; uVar4 < this->threadCount; uVar4 = uVar4 + 1) {
      Memory::
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::ParallelThreadData>
                (&Memory::HeapAllocator::Instance,this->parallelThreadData[uVar4]);
    }
    Memory::DeleteArray<Memory::HeapAllocator,JsUtil::ParallelThreadData*>
              (&Memory::HeapAllocator::Instance,(ulong)this->maxThreadCount,this->parallelThreadData
              );
  }
  Event::~Event(&this->wakeAllBackgroundThreads);
  Event::~Event(&this->jobReady);
  CCLock::~CCLock(&(this->criticalSection).super_CCLock);
  return;
}

Assistant:

BackgroundJobProcessor::~BackgroundJobProcessor()
    {
        // This should appear to be called from the same thread from which this instance was created
        Assert(IsClosed());

        if (parallelThreadData)
        {
            for (unsigned int i = 0; i < this->threadCount; i++)
            {
                HeapDelete(parallelThreadData[i]);
            }
            HeapDeleteArray(this->maxThreadCount, parallelThreadData);
        }
    }